

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

int asio_service_test::message_meta_random_denial_test(void)

{
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  bool bVar1;
  int iVar2;
  reference ppRVar3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  element_type *peVar7;
  int __how;
  int __how_00;
  int __how_01;
  allocator<char> *this;
  buffer_serializer bs;
  ptr<buffer> msg;
  string msg_str;
  size_t ii;
  int _v_4;
  int _ev_2;
  int _v_3;
  int _ev_1;
  int _v_2;
  int _ev;
  int _v_1;
  int _v;
  RaftAsioPkg *rr;
  iterator __end1;
  iterator __begin1;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *__range1;
  atomic<bool> start_denial;
  atomic<unsigned_long> write_resp_cb_count;
  atomic<unsigned_long> write_req_cb_count;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  RaftAsioPkg s1;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  raft_server *in_stack_fffffffffffff0a8;
  allocator *msg_00;
  RaftAsioPkg *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0b8;
  int in_stack_fffffffffffff0bc;
  RaftAsioPkg *in_stack_fffffffffffff0c0;
  undefined7 in_stack_fffffffffffff0c8;
  undefined1 in_stack_fffffffffffff0cf;
  WRITE_META_FUNC *in_stack_fffffffffffff0d0;
  READ_META_FUNC *in_stack_fffffffffffff0d8;
  READ_META_FUNC *in_stack_fffffffffffff0e0;
  element_type *in_stack_fffffffffffff0e8;
  RaftAsioPkg *in_stack_fffffffffffff0f0;
  _Manager_type p_Var8;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *in_stack_fffffffffffff110;
  raft_server *in_stack_fffffffffffff118;
  size_t in_stack_fffffffffffff1f8;
  init_options *in_stack_fffffffffffff288;
  undefined8 in_stack_fffffffffffff290;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_fffffffffffff298;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *in_stack_fffffffffffff2a8;
  allocator local_7d9;
  string local_7d8 [39];
  undefined1 local_7b1 [41];
  undefined1 local_788 [16];
  READ_META_FUNC local_778 [3];
  string local_718 [40];
  native_handle_type local_6f0;
  char local_6e5;
  int local_6e4;
  string local_6e0 [32];
  int32 local_6c0;
  int local_6bc;
  native_handle_type local_6b8;
  char local_6ad;
  int local_6ac;
  string local_6a8 [32];
  int32 local_688;
  int local_684;
  native_handle_type local_680;
  char local_675;
  int local_674;
  string local_670 [32];
  int32 local_650;
  int local_64c;
  native_handle_type local_648;
  char local_63d;
  int local_63c;
  string local_638 [39];
  allocator local_611;
  string local_610 [32];
  native_handle_type local_5f0;
  char local_5e5;
  int local_5e4;
  string local_5e0 [32];
  int local_5c0;
  undefined4 local_5bc;
  native_handle_type local_5b8;
  char local_5ad;
  int local_5ac;
  string local_5a8 [84];
  int local_554;
  undefined8 *local_550;
  undefined1 *local_518;
  undefined8 *local_4e0;
  undefined1 *local_4a8;
  RaftAsioPkg *local_470;
  RaftAsioPkg **local_468;
  __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
  local_460;
  undefined1 *local_458;
  undefined1 local_449;
  undefined8 local_448;
  undefined8 local_440 [2];
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  undefined1 **local_418;
  undefined8 local_410;
  undefined1 local_408 [24];
  undefined1 local_3f0 [288];
  undefined1 local_2d0 [288];
  undefined1 local_1b0 [295];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [36];
  int local_4;
  
  raft_functional_common::reset_log_files();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"127.0.0.1:20010",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"127.0.0.1:20020",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"127.0.0.1:20030",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  RaftAsioPkg::RaftAsioPkg
            (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0bc,(string *)in_stack_fffffffffffff0b0
            );
  RaftAsioPkg::RaftAsioPkg
            (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0bc,(string *)in_stack_fffffffffffff0b0
            );
  RaftAsioPkg::RaftAsioPkg
            (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0bc,(string *)in_stack_fffffffffffff0b0
            );
  local_430 = local_1b0;
  local_428 = local_2d0;
  local_420 = local_3f0;
  local_418 = &local_430;
  local_410 = 3;
  std::allocator<RaftAsioPkg_*>::allocator((allocator<RaftAsioPkg_*> *)0x190731);
  __l._M_len = (size_type)in_stack_fffffffffffff0f0;
  __l._M_array = (iterator)in_stack_fffffffffffff0e8;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_fffffffffffff0e0,__l,
             (allocator_type *)in_stack_fffffffffffff0d8);
  std::allocator<RaftAsioPkg_*>::~allocator((allocator<RaftAsioPkg_*> *)0x190765);
  local_440[0] = 0;
  local_448 = 0;
  local_449 = 0;
  TestSuite::_msg("launching asio-raft servers with meta callback\n");
  local_458 = local_408;
  local_460._M_current =
       (RaftAsioPkg **)
       std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::begin
                 ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_fffffffffffff0a8
                 );
  local_468 = (RaftAsioPkg **)
              std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::end
                        ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)
                         in_stack_fffffffffffff0a8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                        *)in_stack_fffffffffffff0b0,
                       (__normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
                        *)in_stack_fffffffffffff0a8);
    if (!bVar1) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>
              ::operator*(&local_460);
    local_470 = *ppRVar3;
    local_4a8 = &local_449;
    std::
    bind<bool(&)(std::atomic<bool>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&),std::atomic<bool>*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((_func_bool_atomic<bool>_ptr_asio_service_meta_cb_params_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8),
               (atomic<bool> **)in_stack_fffffffffffff0c0,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
               (_Placeholder<2> *)in_stack_fffffffffffff0b0);
    std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
    function<std::_Bind<bool(*(std::atomic<bool>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<bool>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
              ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffff0c0,
               (_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    local_4e0 = local_440;
    std::
    bind<std::__cxx11::string(&)(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&),std::atomic<unsigned_long>*,std::_Placeholder<1>const&>
              ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_atomic<unsigned_long>_ptr_asio_service_meta_cb_params_ptr
                *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8),
               (atomic<unsigned_long> **)in_stack_fffffffffffff0c0,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
    function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                *)in_stack_fffffffffffff0c0,
               (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
                *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    local_518 = &local_449;
    std::
    bind<bool(&)(std::atomic<bool>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&),std::atomic<bool>*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((_func_bool_atomic<bool>_ptr_asio_service_meta_cb_params_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8),
               (atomic<bool> **)in_stack_fffffffffffff0c0,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
               (_Placeholder<2> *)in_stack_fffffffffffff0b0);
    std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
    function<std::_Bind<bool(*(std::atomic<bool>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<bool>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
              ((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffff0c0,
               (_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    local_550 = &local_448;
    std::
    bind<std::__cxx11::string(&)(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&),std::atomic<unsigned_long>*,std::_Placeholder<1>const&>
              ((_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_atomic<unsigned_long>_ptr_asio_service_meta_cb_params_ptr
                *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8),
               (atomic<unsigned_long> **)in_stack_fffffffffffff0c0,
               (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
    function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                *)in_stack_fffffffffffff0c0,
               (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
                *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
    RaftAsioPkg::setMetaCallback
              (in_stack_fffffffffffff0f0,(READ_META_FUNC *)in_stack_fffffffffffff0e8,
               (WRITE_META_FUNC *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
               in_stack_fffffffffffff0d0,(bool)in_stack_fffffffffffff0cf);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                 *)0x190995);
    std::
    function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1909a2);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
                 *)0x1909af);
    std::
    function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1909bc);
    __gnu_cxx::
    __normal_iterator<RaftAsioPkg_**,_std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>_>::
    operator++(&local_460);
  }
  nuraft::raft_server::init_options::init_options((init_options *)in_stack_fffffffffffff0b0);
  iVar2 = launch_servers(in_stack_fffffffffffff298,SUB81((ulong)in_stack_fffffffffffff290 >> 0x38,0)
                         ,SUB81((ulong)in_stack_fffffffffffff290 >> 0x30,0),
                         SUB81((ulong)in_stack_fffffffffffff290 >> 0x28,0),in_stack_fffffffffffff288
                        );
  nuraft::raft_server::init_options::~init_options((init_options *)0x190b9c);
  local_554 = iVar2;
  if (iVar2 == 0) {
    TestSuite::_msg("organizing raft group\n");
    local_5c0 = make_group(in_stack_fffffffffffff2a8);
    if (local_5c0 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,"wait for Raft group ready",&local_611);
      TestSuite::sleep_sec((size_t)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
      std::__cxx11::string::~string(local_610);
      std::allocator<char>::~allocator((allocator<char> *)&local_611);
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19163e);
      bVar1 = nuraft::raft_server::is_leader(in_stack_fffffffffffff0a8);
      if (bVar1) {
        local_64c = 1;
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x191b98);
        local_650 = nuraft::raft_server::get_leader(in_stack_fffffffffffff0a8);
        if (local_64c == local_650) {
          local_684 = 1;
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1920ba);
          local_688 = nuraft::raft_server::get_leader(in_stack_fffffffffffff0a8);
          if (local_684 == local_688) {
            local_6bc = 1;
            std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1925dc);
            local_6c0 = nuraft::raft_server::get_leader(in_stack_fffffffffffff0a8);
            if (local_6bc == local_6c0) {
              std::atomic<bool>::operator=
                        ((atomic<bool> *)in_stack_fffffffffffff0b0,
                         SUB81((ulong)in_stack_fffffffffffff0a8 >> 0x38,0));
              local_718[0x20] = (string)0x0;
              local_718[0x21] = (string)0x0;
              local_718[0x22] = (string)0x0;
              local_718[0x23] = (string)0x0;
              local_718[0x24] = (string)0x0;
              local_718[0x25] = (string)0x0;
              local_718[0x26] = (string)0x0;
              local_718[0x27] = (string)0x0;
              for (; (ulong)local_718._32_8_ < 100; local_718._32_8_ = local_718._32_8_ + 1) {
                std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffff0e8);
                std::__cxx11::string::size();
                nuraft::buffer::alloc(in_stack_fffffffffffff1f8);
                nuraft::buffer_serializer::buffer_serializer
                          ((buffer_serializer *)in_stack_fffffffffffff0c0,
                           (ptr<buffer> *)
                           CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                           (endianness)((ulong)in_stack_fffffffffffff0b0 >> 0x20));
                nuraft::buffer_serializer::put_str
                          ((buffer_serializer *)in_stack_fffffffffffff0c0,
                           (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8));
                in_stack_fffffffffffff0e8 =
                     std::
                     __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x192b6c);
                p_Var8 = (_Manager_type)local_788;
                std::shared_ptr<nuraft::buffer>::shared_ptr
                          ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffff0b0,
                           (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffff0a8);
                local_778[0].super__Function_base._M_functor._8_8_ = (_Invoker_type)0x1;
                local_778[0].super__Function_base._M_functor._0_8_ = p_Var8;
                std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
                          ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x192bb6);
                __l_00._M_len = (size_type)p_Var8;
                __l_00._M_array = (iterator)in_stack_fffffffffffff0e8;
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                          *)in_stack_fffffffffffff0e0,__l_00,
                         (allocator_type *)in_stack_fffffffffffff0d8);
                nuraft::raft_server::append_entries
                          (in_stack_fffffffffffff118,in_stack_fffffffffffff110);
                std::
                shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                               *)0x192c03);
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                           *)in_stack_fffffffffffff0c0);
                std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
                          ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x192c1d);
                in_stack_fffffffffffff0d8 = (READ_META_FUNC *)local_788;
                in_stack_fffffffffffff0e0 = local_778;
                do {
                  in_stack_fffffffffffff0e0 =
                       (READ_META_FUNC *)
                       &in_stack_fffffffffffff0e0[-1].super__Function_base._M_manager;
                  std::shared_ptr<nuraft::buffer>::~shared_ptr
                            ((shared_ptr<nuraft::buffer> *)0x192c46);
                } while (in_stack_fffffffffffff0e0 != in_stack_fffffffffffff0d8);
                std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x192c67)
                ;
                std::__cxx11::string::~string(local_718);
              }
              in_stack_fffffffffffff0b0 = (RaftAsioPkg *)local_7b1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_7b1 + 1),"wait for random denial",
                         (allocator *)in_stack_fffffffffffff0b0);
              iVar2 = (int)local_7b1 + 1;
              TestSuite::sleep_sec
                        ((size_t)in_stack_fffffffffffff0b0,(string *)in_stack_fffffffffffff0a8);
              std::__cxx11::string::~string((string *)(local_7b1 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_7b1);
              peVar7 = std::
                       __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x192dc9);
              nuraft::raft_server::shutdown(peVar7,iVar2,__how);
              peVar7 = std::
                       __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x192de0);
              nuraft::raft_server::shutdown(peVar7,iVar2,__how_00);
              peVar7 = std::
                       __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x192df7);
              nuraft::raft_server::shutdown(peVar7,iVar2,__how_01);
              msg_00 = &local_7d9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_7d8,"shutting down",msg_00);
              iVar2 = (int)local_7d8;
              TestSuite::sleep_sec((size_t)in_stack_fffffffffffff0b0,(string *)msg_00);
              std::__cxx11::string::~string(local_7d8);
              this = (allocator<char> *)&local_7d9;
              std::allocator<char>::~allocator(this);
              SimpleLogger::shutdown((int)this,iVar2);
              local_4 = 0;
            }
            else {
              poVar4 = (ostream *)
                       std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(poVar4,"        time: ");
              poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
              TestSuite::getTimeString_abi_cxx11_();
              poVar4 = std::operator<<(poVar4,local_6e0);
              poVar4 = std::operator<<(poVar4,"\x1b[0m");
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"      thread: ");
              poVar4 = std::operator<<(poVar4,"\x1b[33m");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
              local_6e4 = (int)std::setw(4);
              poVar4 = std::operator<<(poVar4,(_Setw)local_6e4);
              local_6e5 = (char)std::setfill<char>('0');
              poVar4 = std::operator<<(poVar4,local_6e5);
              local_6f0 = (native_handle_type)std::this_thread::get_id();
              sVar5 = std::hash<std::thread::id>::operator()
                                ((hash<std::thread::id> *)in_stack_fffffffffffff0b0,
                                 (id *)in_stack_fffffffffffff0a8);
              pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
              poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
              poVar4 = std::operator<<(poVar4,"\x1b[0m");
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"          in: ");
              poVar4 = std::operator<<(poVar4,"\x1b[36m");
              poVar4 = std::operator<<(poVar4,"message_meta_random_denial_test");
              poVar4 = std::operator<<(poVar4,"()\x1b[0m");
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"          at: ");
              poVar4 = std::operator<<(poVar4,"\x1b[32m");
              poVar4 = std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                      );
              poVar4 = std::operator<<(poVar4,"\x1b[0m:");
              poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1ea);
              poVar4 = std::operator<<(poVar4,"\x1b[0m");
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,
                                       "    value of: \x1b[1;34ms3.raftServer->get_leader()\x1b[0m\n"
                                      );
              poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6bc);
              poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
              poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_6c0);
              std::operator<<(poVar4,"\x1b[0m\n");
              std::__cxx11::string::~string(local_6e0);
              TestSuite::failHandler();
              local_4 = -1;
            }
          }
          else {
            poVar4 = (ostream *)
                     std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<(poVar4,"        time: ");
            poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar4 = std::operator<<(poVar4,local_6a8);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"      thread: ");
            poVar4 = std::operator<<(poVar4,"\x1b[33m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
            local_6ac = (int)std::setw(4);
            poVar4 = std::operator<<(poVar4,(_Setw)local_6ac);
            local_6ad = (char)std::setfill<char>('0');
            poVar4 = std::operator<<(poVar4,local_6ad);
            local_6b8 = (native_handle_type)std::this_thread::get_id();
            sVar5 = std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)in_stack_fffffffffffff0b0,
                               (id *)in_stack_fffffffffffff0a8);
            pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
            poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"          in: ");
            poVar4 = std::operator<<(poVar4,"\x1b[36m");
            poVar4 = std::operator<<(poVar4,"message_meta_random_denial_test");
            poVar4 = std::operator<<(poVar4,"()\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"          at: ");
            poVar4 = std::operator<<(poVar4,"\x1b[32m");
            poVar4 = std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar4 = std::operator<<(poVar4,"\x1b[0m:");
            poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e9);
            poVar4 = std::operator<<(poVar4,"\x1b[0m");
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,
                                     "    value of: \x1b[1;34ms2.raftServer->get_leader()\x1b[0m\n")
            ;
            poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_684);
            poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
            poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_688);
            std::operator<<(poVar4,"\x1b[0m\n");
            std::__cxx11::string::~string(local_6a8);
            TestSuite::failHandler();
            local_4 = -1;
          }
        }
        else {
          poVar4 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,"        time: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar4 = std::operator<<(poVar4,local_670);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"      thread: ");
          poVar4 = std::operator<<(poVar4,"\x1b[33m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          local_674 = (int)std::setw(4);
          poVar4 = std::operator<<(poVar4,(_Setw)local_674);
          local_675 = (char)std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,local_675);
          local_680 = (native_handle_type)std::this_thread::get_id();
          sVar5 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_fffffffffffff0b0,
                             (id *)in_stack_fffffffffffff0a8);
          pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          in: ");
          poVar4 = std::operator<<(poVar4,"\x1b[36m");
          poVar4 = std::operator<<(poVar4,"message_meta_random_denial_test");
          poVar4 = std::operator<<(poVar4,"()\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          at: ");
          poVar4 = std::operator<<(poVar4,"\x1b[32m");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[0m:");
          poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e8);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,
                                   "    value of: \x1b[1;34ms1.raftServer->get_leader()\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_64c);
          poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
          poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_650);
          std::operator<<(poVar4,"\x1b[0m\n");
          std::__cxx11::string::~string(local_670);
          TestSuite::failHandler();
          local_4 = -1;
        }
      }
      else {
        poVar4 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"        time: ");
        poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,local_638);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"      thread: ");
        poVar4 = std::operator<<(poVar4,"\x1b[33m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
        local_63c = (int)std::setw(4);
        poVar4 = std::operator<<(poVar4,(_Setw)local_63c);
        local_63d = (char)std::setfill<char>('0');
        poVar4 = std::operator<<(poVar4,local_63d);
        local_648 = (native_handle_type)std::this_thread::get_id();
        sVar5 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_fffffffffffff0b0,
                           (id *)in_stack_fffffffffffff0a8);
        pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"          in: ");
        poVar4 = std::operator<<(poVar4,"\x1b[36m");
        poVar4 = std::operator<<(poVar4,"message_meta_random_denial_test");
        poVar4 = std::operator<<(poVar4,"()\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"          at: ");
        poVar4 = std::operator<<(poVar4,"\x1b[32m");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar4 = std::operator<<(poVar4,"\x1b[0m:");
        poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e7);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,
                                 "    value of: \x1b[1;34ms1.raftServer->is_leader()\x1b[0m\n");
        poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
        poVar4 = std::operator<<(poVar4,"true");
        poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
        poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
        poVar4 = std::operator<<(poVar4,"false");
        std::operator<<(poVar4,"\x1b[0m\n");
        std::__cxx11::string::~string(local_638);
        TestSuite::failHandler();
        local_4 = -1;
      }
    }
    else {
      poVar4 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"        time: ");
      poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,local_5e0);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"      thread: ");
      poVar4 = std::operator<<(poVar4,"\x1b[33m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
      local_5e4 = (int)std::setw(4);
      poVar4 = std::operator<<(poVar4,(_Setw)local_5e4);
      local_5e5 = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_5e5);
      local_5f0 = (native_handle_type)std::this_thread::get_id();
      sVar5 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_fffffffffffff0b0,
                         (id *)in_stack_fffffffffffff0a8);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          in: ");
      poVar4 = std::operator<<(poVar4,"\x1b[36m");
      poVar4 = std::operator<<(poVar4,"message_meta_random_denial_test");
      poVar4 = std::operator<<(poVar4,"()\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          at: ");
      poVar4 = std::operator<<(poVar4,"\x1b[32m");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar4 = std::operator<<(poVar4,"\x1b[0m:");
      poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e3);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
      poVar4 = std::operator<<(poVar4,"0");
      poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_5c0);
      std::operator<<(poVar4,"\x1b[0m\n");
      std::__cxx11::string::~string(local_5e0);
      TestSuite::failHandler();
      local_4 = -1;
    }
  }
  else {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"        time: ");
    poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_5a8);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"      thread: ");
    poVar4 = std::operator<<(poVar4,"\x1b[33m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    local_5ac = (int)std::setw(4);
    poVar4 = std::operator<<(poVar4,(_Setw)local_5ac);
    local_5ad = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,local_5ad);
    local_5b8 = (native_handle_type)std::this_thread::get_id();
    sVar5 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_fffffffffffff0b0,
                       (id *)in_stack_fffffffffffff0a8);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          in: ");
    poVar4 = std::operator<<(poVar4,"\x1b[36m");
    poVar4 = std::operator<<(poVar4,"message_meta_random_denial_test");
    poVar4 = std::operator<<(poVar4,"()\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          at: ");
    poVar4 = std::operator<<(poVar4,"\x1b[32m");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar4 = std::operator<<(poVar4,"\x1b[0m:");
    poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1e0);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
    poVar4 = std::operator<<(poVar4,"0");
    poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_554);
    std::operator<<(poVar4,"\x1b[0m\n");
    std::__cxx11::string::~string(local_5a8);
    TestSuite::failHandler();
    local_4 = -1;
  }
  local_5bc = 1;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~vector
            ((vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> *)in_stack_fffffffffffff0c0);
  RaftAsioPkg::~RaftAsioPkg(in_stack_fffffffffffff0b0);
  RaftAsioPkg::~RaftAsioPkg(in_stack_fffffffffffff0b0);
  RaftAsioPkg::~RaftAsioPkg(in_stack_fffffffffffff0b0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return local_4;
}

Assistant:

int message_meta_random_denial_test() {
    reset_log_files();

    std::string s1_addr = "127.0.0.1:20010";
    std::string s2_addr = "127.0.0.1:20020";
    std::string s3_addr = "127.0.0.1:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    std::atomic<size_t> write_req_cb_count(0);
    std::atomic<size_t> write_resp_cb_count(0);
    std::atomic<bool> start_denial(false);

    _msg("launching asio-raft servers with meta callback\n");
    for (RaftAsioPkg* rr: pkgs) {
        rr->setMetaCallback
            ( std::bind( test_read_meta_random_denial,
                         &start_denial,
                         std::placeholders::_1,
                         std::placeholders::_2 ),
              std::bind( test_write_req_meta,
                         &write_req_cb_count,
                         std::placeholders::_1 ),
              std::bind( test_read_meta_random_denial,
                         &start_denial,
                         std::placeholders::_1,
                         std::placeholders::_2 ),
              std::bind( test_write_resp_meta,
                         &write_resp_cb_count,
                         std::placeholders::_1 ),
              true );
    }
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    TestSuite::sleep_sec(1, "wait for Raft group ready");

    CHK_TRUE( s1.raftServer->is_leader() );
    CHK_EQ(1, s1.raftServer->get_leader());
    CHK_EQ(1, s2.raftServer->get_leader());
    CHK_EQ(1, s3.raftServer->get_leader());

    start_denial = true;

    for (size_t ii=0; ii<100; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }

    TestSuite::sleep_sec(5, "wait for random denial");

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}